

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3InitCallback(void *pInit,int argc,char **argv,char **NotUsed)

{
  u16 *puVar1;
  u8 uVar2;
  sqlite3 *db;
  Db *pDVar3;
  int iVar4;
  int iVar5;
  Index *pIVar6;
  char *pcVar7;
  char *pcVar8;
  sqlite3_stmt *pStmt;
  
  db = *pInit;
  iVar5 = *(int *)((long)pInit + 0x10);
  pDVar3 = db->aDb;
  puVar1 = &(pDVar3[iVar5].pSchema)->schemaFlags;
  *puVar1 = *puVar1 & 0xfffb;
  if (db->mallocFailed != '\0') {
    corruptSchema((InitData *)pInit,*argv,(char *)0x0);
    return 1;
  }
  if (argv == (char **)0x0) {
    return 0;
  }
  pcVar8 = argv[1];
  if (pcVar8 == (char *)0x0) {
    pcVar8 = *argv;
  }
  else {
    pcVar7 = argv[2];
    iVar4 = sqlite3_strnicmp(pcVar7,"create ",7);
    if (iVar4 == 0) {
      uVar2 = (db->init).iDb;
      (db->init).iDb = (u8)iVar5;
      iVar5 = sqlite3Atoi(pcVar8);
      (db->init).newTnum = iVar5;
      (db->init).orphanTrigger = '\0';
      sqlite3_prepare(db,pcVar7,-1,&pStmt,(char **)0x0);
      iVar5 = db->errCode;
      (db->init).iDb = uVar2;
      if (((iVar5 != 0) && ((db->init).orphanTrigger == '\0')) &&
         (*(int *)((long)pInit + 0x14) = iVar5, iVar5 != 9)) {
        if (iVar5 == 7) {
          sqlite3OomFault(db);
        }
        else if ((char)iVar5 != '\x06') {
          pcVar8 = *argv;
          pcVar7 = sqlite3_errmsg(db);
          corruptSchema((InitData *)pInit,pcVar8,pcVar7);
        }
      }
      sqlite3_finalize(pStmt);
      return 0;
    }
    pcVar8 = *argv;
    if ((pcVar8 != (char *)0x0) && ((pcVar7 == (char *)0x0 || (*pcVar7 == '\0')))) {
      pIVar6 = sqlite3FindIndex(db,pcVar8,pDVar3[iVar5].zDbSName);
      if (pIVar6 == (Index *)0x0) {
        return 0;
      }
      iVar5 = sqlite3GetInt32(argv[1],&pIVar6->tnum);
      if (iVar5 != 0) {
        return 0;
      }
      pcVar8 = *argv;
      pcVar7 = "invalid rootpage";
      goto LAB_00234ad4;
    }
  }
  pcVar7 = (char *)0x0;
LAB_00234ad4:
  corruptSchema((InitData *)pInit,pcVar8,pcVar7);
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3InitCallback(void *pInit, int argc, char **argv, char **NotUsed){
  InitData *pData = (InitData*)pInit;
  sqlite3 *db = pData->db;
  int iDb = pData->iDb;

  assert( argc==3 );
  UNUSED_PARAMETER2(NotUsed, argc);
  assert( sqlite3_mutex_held(db->mutex) );
  DbClearProperty(db, iDb, DB_Empty);
  if( db->mallocFailed ){
    corruptSchema(pData, argv[0], 0);
    return 1;
  }

  assert( iDb>=0 && iDb<db->nDb );
  if( argv==0 ) return 0;   /* Might happen if EMPTY_RESULT_CALLBACKS are on */
  if( argv[1]==0 ){
    corruptSchema(pData, argv[0], 0);
  }else if( sqlite3_strnicmp(argv[2],"create ",7)==0 ){
    /* Call the parser to process a CREATE TABLE, INDEX or VIEW.
    ** But because db->init.busy is set to 1, no VDBE code is generated
    ** or executed.  All the parser does is build the internal data
    ** structures that describe the table, index, or view.
    */
    int rc;
    u8 saved_iDb = db->init.iDb;
    sqlite3_stmt *pStmt;
    TESTONLY(int rcp);            /* Return code from sqlite3_prepare() */

    assert( db->init.busy );
    db->init.iDb = iDb;
    db->init.newTnum = sqlite3Atoi(argv[1]);
    db->init.orphanTrigger = 0;
    TESTONLY(rcp = ) sqlite3_prepare(db, argv[2], -1, &pStmt, 0);
    rc = db->errCode;
    assert( (rc&0xFF)==(rcp&0xFF) );
    db->init.iDb = saved_iDb;
    assert( saved_iDb==0 || (db->flags & SQLITE_Vacuum)!=0 );
    if( SQLITE_OK!=rc ){
      if( db->init.orphanTrigger ){
        assert( iDb==1 );
      }else{
        pData->rc = rc;
        if( rc==SQLITE_NOMEM ){
          sqlite3OomFault(db);
        }else if( rc!=SQLITE_INTERRUPT && (rc&0xFF)!=SQLITE_LOCKED ){
          corruptSchema(pData, argv[0], sqlite3_errmsg(db));
        }
      }
    }
    sqlite3_finalize(pStmt);
  }else if( argv[0]==0 || (argv[2]!=0 && argv[2][0]!=0) ){
    corruptSchema(pData, argv[0], 0);
  }else{
    /* If the SQL column is blank it means this is an index that
    ** was created to be the PRIMARY KEY or to fulfill a UNIQUE
    ** constraint for a CREATE TABLE.  The index should have already
    ** been created when we processed the CREATE TABLE.  All we have
    ** to do here is record the root page number for that index.
    */
    Index *pIndex;
    pIndex = sqlite3FindIndex(db, argv[0], db->aDb[iDb].zDbSName);
    if( pIndex==0 ){
      /* This can occur if there exists an index on a TEMP table which
      ** has the same name as another index on a permanent index.  Since
      ** the permanent table is hidden by the TEMP table, we can also
      ** safely ignore the index on the permanent table.
      */
      /* Do Nothing */;
    }else if( sqlite3GetInt32(argv[1], &pIndex->tnum)==0 ){
      corruptSchema(pData, argv[0], "invalid rootpage");
    }
  }
  return 0;
}